

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::(anonymous_namespace)::
     TryConvertFacevaryingToVertexFloat<tinyusdz::value::half,float>
               (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *src,
               vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,float eps)

{
  uint uVar1;
  half h;
  pointer puVar2;
  _Hash_node_base *p_Var3;
  pointer phVar4;
  pointer puVar5;
  mapped_type *pmVar6;
  __node_base _Var7;
  __hash_code __code;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  size_type __new_size;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint32_t vidx;
  unordered_map<unsigned_int,_tinyusdz::value::half,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>_>
  vdata;
  uint local_84;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *local_80;
  float local_78;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0) {
    bVar9 = false;
  }
  else {
    puVar5 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar8 = (long)puVar2 - (long)puVar5 >> 2;
    bVar9 = false;
    if (((long)(src->
               super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(src->
               super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
               _M_impl.super__Vector_impl_data._M_start >> 1 == uVar8) && (bVar9 = false, 2 < uVar8)
       ) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      if (puVar2 == puVar5) {
        __new_size = 1;
      }
      else {
        uVar8 = 0;
        uVar10 = 0;
        local_80 = dst;
        do {
          local_84 = puVar5[uVar8];
          if (uVar10 < local_84) {
            uVar10 = local_84;
          }
          if (local_68._M_buckets[(ulong)local_84 % local_68._M_bucket_count] !=
              (__node_base_ptr)0x0) {
            p_Var3 = local_68._M_buckets[(ulong)local_84 % local_68._M_bucket_count]->_M_nxt;
            uVar1 = *(uint *)&p_Var3[1]._M_nxt;
            do {
              if (local_84 == uVar1) {
                pmVar6 = ::std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,&local_84);
                h.value = (src->
                          super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar8].value;
                local_78 = tinyusdz::value::half_to_float((half)pmVar6->value);
                fVar11 = tinyusdz::value::half_to_float(h);
                if (ABS(local_78 - fVar11) <= eps) goto LAB_00377974;
                fVar14 = ABS(local_78);
                fVar12 = ABS(fVar11);
                fVar13 = fVar12;
                if (fVar12 <= fVar14) {
                  fVar13 = fVar14;
                }
                if (ABS(local_78 - fVar11) <=
                    (float)(~-(uint)NAN(fVar14) & (uint)fVar13 | -(uint)NAN(fVar14) & (uint)fVar12)
                    * eps) goto LAB_00377974;
                bVar9 = false;
                goto LAB_003779e0;
              }
              p_Var3 = p_Var3->_M_nxt;
            } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                    (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                    (ulong)uVar1 % local_68._M_bucket_count ==
                    (ulong)local_84 % local_68._M_bucket_count));
          }
          phVar4 = (src->
                   super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pmVar6 = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_68,&local_84);
          pmVar6->value = phVar4[uVar8].value;
LAB_00377974:
          uVar8 = uVar8 + 1;
          puVar5 = (faceVertexIndices->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)(faceVertexIndices->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >>
                                2));
        __new_size = (size_type)(uVar10 + 1);
        dst = local_80;
      }
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
                (dst,__new_size);
      memset((dst->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
             )._M_impl.super__Vector_impl_data._M_start,0,__new_size * 2);
      bVar9 = true;
      if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        phVar4 = (dst->
                 super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        _Var7._M_nxt = local_68._M_before_begin._M_nxt;
        do {
          phVar4[*(uint *)&_Var7._M_nxt[1]._M_nxt].value =
               *(uint16_t *)((long)&_Var7._M_nxt[1]._M_nxt + 4);
          _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt;
        } while (_Var7._M_nxt != (_Hash_node_base *)0x0);
      }
LAB_003779e0:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar9;
}

Assistant:

bool TryConvertFacevaryingToVertexFloat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices, const EpsTy eps) {
  DCOUT("TryConvertFacevaryingToVertexFloat");
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    DCOUT("size mismatch.");
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i], eps)) {
        DCOUT("diff at faceVertexIndices[" << i << "]");
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}